

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O0

string * __thiscall cmCTestBZR::LoadInfo_abi_cxx11_(string *__return_storage_ptr__,cmCTestBZR *this)

{
  char *pcVar1;
  undefined1 local_3f8 [8];
  OutputLogger rerr;
  RevnoParser rout;
  char *local_298;
  char *bzr_revno [3];
  undefined1 local_268 [8];
  OutputLogger ierr;
  InfoParser iout;
  char *bzr_info [3];
  char *bzr;
  cmCTestBZR *this_local;
  string *rev;
  
  pcVar1 = (char *)std::__cxx11::string::c_str();
  iout.RegexParent.searchstring = pcVar1;
  InfoParser::InfoParser((InfoParser *)&ierr.super_LineParser.Separator,this,"info-out> ");
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)local_268,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
             "info-err> ");
  cmCTestVC::RunChild((cmCTestVC *)this,&iout.RegexParent.searchstring,
                      (OutputParser *)&ierr.super_LineParser.Separator,(OutputParser *)local_268,
                      (char *)0x0,Auto);
  bzr_revno[0] = "revno";
  bzr_revno[1] = (char *)0x0;
  local_298 = pcVar1;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  RevnoParser::RevnoParser
            ((RevnoParser *)&rerr.super_LineParser.Separator,this,"revno-out> ",
             __return_storage_ptr__);
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)local_3f8,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
             "revno-err> ");
  cmCTestVC::RunChild((cmCTestVC *)this,&local_298,(OutputParser *)&rerr.super_LineParser.Separator,
                      (OutputParser *)local_3f8,(char *)0x0,Auto);
  cmProcessTools::OutputLogger::~OutputLogger((OutputLogger *)local_3f8);
  RevnoParser::~RevnoParser((RevnoParser *)&rerr.super_LineParser.Separator);
  cmProcessTools::OutputLogger::~OutputLogger((OutputLogger *)local_268);
  InfoParser::~InfoParser((InfoParser *)&ierr.super_LineParser.Separator);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestBZR::LoadInfo()
{
  // Run "bzr info" to get the repository info from the work tree.
  const char* bzr = this->CommandLineTool.c_str();
  const char* bzr_info[] = { bzr, "info", CM_NULLPTR };
  InfoParser iout(this, "info-out> ");
  OutputLogger ierr(this->Log, "info-err> ");
  this->RunChild(bzr_info, &iout, &ierr);

  // Run "bzr revno" to get the repository revision number from the work tree.
  const char* bzr_revno[] = { bzr, "revno", CM_NULLPTR };
  std::string rev;
  RevnoParser rout(this, "revno-out> ", rev);
  OutputLogger rerr(this->Log, "revno-err> ");
  this->RunChild(bzr_revno, &rout, &rerr);

  return rev;
}